

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  ulong *puVar1;
  Enum EVar2;
  Memory *args;
  Global *args_00;
  Table *args_01;
  DataSegment *pDVar3;
  Func *f;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  size_type sVar4;
  LoadStoreTracking *this_00;
  char cVar5;
  bool bVar6;
  Module *pMVar7;
  long *plVar8;
  pointer pTVar9;
  int iVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char *args_1_00;
  ulong uVar11;
  char **ppcVar12;
  char **ppcVar13;
  Index IVar14;
  Type t;
  char cVar15;
  char (*args_2) [2];
  char cVar16;
  pointer ppFVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  pointer ppMVar21;
  pointer ppGVar22;
  pointer ppTVar23;
  pointer ppDVar24;
  _Alloc_hider _Var25;
  string __str;
  string __str_1;
  string ds;
  char (*in_stack_fffffffffffffe78) [5];
  string local_170;
  pointer local_150;
  string local_148;
  string *local_128;
  Index local_11c;
  LoadStoreTracking *local_118;
  _Base_ptr local_110;
  Func **local_108;
  pointer local_100;
  AST local_f8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pMVar7 = (this->mc).module;
  ppMVar21 = (pMVar7->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar17 = (pointer)(pMVar7->memories).
                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if ((pointer)ppMVar21 != ppFVar17) {
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_150 = ppFVar17;
    do {
      args = *ppMVar21;
      name.data_ = (args->name)._M_dataplus._M_p;
      name.size_ = (args->name)._M_string_length;
      IVar14 = (Index)args_1;
      bVar6 = CheckImportExport(this,__return_storage_ptr__,Memory,IVar14,name);
      cat<char[8],std::__cxx11::string>
                ((string *)&local_f8,(wabt *)"memory ",(char (*) [8])args,args_1);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      if (!bVar6) {
        uVar18 = (args->page_limits).initial;
        cVar16 = '\x01';
        cVar15 = '\x01';
        if (9 < uVar18) {
          uVar11 = uVar18;
          cVar5 = '\x04';
          do {
            cVar15 = cVar5;
            if (uVar11 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_00145cae;
            }
            if (uVar11 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_00145cae;
            }
            if (uVar11 < 10000) goto LAB_00145cae;
            bVar6 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar5 = cVar15 + '\x04';
          } while (bVar6);
          cVar15 = cVar15 + '\x01';
        }
LAB_00145cae:
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_170,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_170._M_dataplus._M_p,(uint)local_170._M_string_length,uVar18);
        uVar18 = (args->page_limits).max;
        if (9 < uVar18) {
          uVar11 = uVar18;
          cVar15 = '\x04';
          do {
            cVar16 = cVar15;
            if (uVar11 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_00145d35;
            }
            if (uVar11 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_00145d35;
            }
            if (uVar11 < 10000) goto LAB_00145d35;
            bVar6 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar15 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_00145d35:
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_148,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_148._M_dataplus._M_p,(uint)local_148._M_string_length,uVar18);
        cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)&local_f8,(wabt *)"(initial: ",(char (*) [11])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a72df,
                   (char (*) [2])in_stack_fffffffffffffe78);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
        if (local_f8.mc !=
            (ModuleContext *)
            ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
            8U)) {
          operator_delete(local_f8.mc);
        }
        ppFVar17 = local_150;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(IVar14 + 1);
      ppMVar21 = ppMVar21 + 1;
    } while ((pointer)ppMVar21 != ppFVar17);
    pMVar7 = (this->mc).module;
    if ((pMVar7->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pMVar7->memories).super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar7 = (this->mc).module;
    }
  }
  ppGVar22 = (pMVar7->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_150 = (pointer)(pMVar7->globals).
                       super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  if ((pointer)ppGVar22 != local_150) {
    IVar14 = 0;
    do {
      args_00 = *ppGVar22;
      ppcVar12 = (char **)(args_00->name)._M_string_length;
      name_00.data_ = (args_00->name)._M_dataplus._M_p;
      name_00.size_ = (args_00->name)._M_string_length;
      bVar6 = CheckImportExport(this,__return_storage_ptr__,Global,IVar14,name_00);
      EVar2 = (args_00->type).enum_;
      local_170._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_170._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_170._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_170._M_dataplus._M_p = "uint";
        break;
      case Exnref:
        local_170._M_dataplus._M_p = "exnref";
        break;
      case 0xffffffe9:
      case Exnref|Hostref:
      case 0xffffffeb:
      case Exnref|I8U:
      case 0xffffffed:
      case 0xfffffff1:
      case Funcref|Hostref:
      case 0xfffffff3:
      case Funcref|I8U:
      case 0xfffffff5:
      case Funcref|I16U:
      case Funcref|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case Hostref:
      case ~F64:
      case ~I8:
switchD_00145ea0_caseD_ffffffe9:
        local_170._M_dataplus._M_p = "ILLEGAL";
        break;
      case Nullref:
        local_170._M_dataplus._M_p = "nullref";
        break;
      case Anyref:
        local_170._M_dataplus._M_p = "anyref";
        break;
      case Funcref:
        local_170._M_dataplus._M_p = "funcref";
        break;
      case I16:
        local_170._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_170._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_170._M_dataplus._M_p = "double";
        break;
      case F32:
        local_170._M_dataplus._M_p = "float";
        break;
      case I64:
        local_170._M_dataplus._M_p = "long";
        break;
      case I32:
        local_170._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_170._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_00145ea0_caseD_ffffffe9;
          local_170._M_dataplus._M_p = "func";
        }
      }
      args_1_00 = ":";
      cat<char[8],std::__cxx11::string,char[2],char_const*>
                ((string *)&local_f8,(wabt *)"global ",(char (*) [8])args_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_170,ppcVar12);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      if (!bVar6) {
        InitExp_abi_cxx11_(&local_170,this,&args_00->init_expr);
        cat<char[4],std::__cxx11::string>
                  ((string *)&local_f8,(wabt *)0x1a515a,(char (*) [4])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1_00);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
        if (local_f8.mc !=
            (ModuleContext *)
            ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
            8U)) {
          operator_delete(local_f8.mc);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar14 = IVar14 + 1;
      ppGVar22 = ppGVar22 + 1;
    } while ((pointer)ppGVar22 != local_150);
    pMVar7 = (this->mc).module;
    if ((pMVar7->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pMVar7->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar7 = (this->mc).module;
    }
  }
  ppTVar23 = (pMVar7->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppFVar17 = (pointer)(pMVar7->tables).
                      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
  if ((pointer)ppTVar23 != ppFVar17) {
    IVar14 = 0;
    local_150 = ppFVar17;
    do {
      args_01 = *ppTVar23;
      ppcVar12 = (char **)(args_01->name)._M_string_length;
      name_01.data_ = (args_01->name)._M_dataplus._M_p;
      name_01.size_ = (args_01->name)._M_string_length;
      bVar6 = CheckImportExport(this,__return_storage_ptr__,Table,IVar14,name_01);
      EVar2 = (args_01->elem_type).enum_;
      local_170._M_dataplus._M_p = "byte";
      switch(EVar2) {
      case I8U:
        local_170._M_dataplus._M_p = "ubyte";
        break;
      case I16U:
        local_170._M_dataplus._M_p = "ushort";
        break;
      case I32U:
        local_170._M_dataplus._M_p = "uint";
        break;
      case Exnref:
        local_170._M_dataplus._M_p = "exnref";
        break;
      case 0xffffffe9:
      case Exnref|Hostref:
      case 0xffffffeb:
      case Exnref|I8U:
      case 0xffffffed:
      case 0xfffffff1:
      case Funcref|Hostref:
      case 0xfffffff3:
      case Funcref|I8U:
      case 0xfffffff5:
      case Funcref|I16U:
      case Funcref|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case Hostref:
      case ~F64:
      case ~I8:
switchD_001460c1_caseD_ffffffe9:
        local_170._M_dataplus._M_p = "ILLEGAL";
        break;
      case Nullref:
        local_170._M_dataplus._M_p = "nullref";
        break;
      case Anyref:
        local_170._M_dataplus._M_p = "anyref";
        break;
      case Funcref:
        local_170._M_dataplus._M_p = "funcref";
        break;
      case I16:
        local_170._M_dataplus._M_p = "short";
        break;
      case I8:
        break;
      case V128:
        local_170._M_dataplus._M_p = "simd";
        break;
      case F64:
        local_170._M_dataplus._M_p = "double";
        break;
      case F32:
        local_170._M_dataplus._M_p = "float";
        break;
      case I64:
        local_170._M_dataplus._M_p = "long";
        break;
      case I32:
        local_170._M_dataplus._M_p = "int";
        break;
      default:
        if (EVar2 == Void) {
          local_170._M_dataplus._M_p = "void";
        }
        else {
          if (EVar2 != Func) goto switchD_001460c1_caseD_ffffffe9;
          local_170._M_dataplus._M_p = "func";
        }
      }
      cat<char[7],std::__cxx11::string,char[2],char_const*>
                ((string *)&local_f8,(wabt *)"table ",(char (*) [7])args_01,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
                 (char (*) [2])&local_170,ppcVar12);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      if (!bVar6) {
        uVar18 = (args_01->elem_limits).initial;
        cVar16 = '\x01';
        cVar15 = '\x01';
        if (9 < uVar18) {
          uVar11 = uVar18;
          cVar5 = '\x04';
          do {
            cVar15 = cVar5;
            if (uVar11 < 100) {
              cVar15 = cVar15 + -2;
              goto LAB_0014622a;
            }
            if (uVar11 < 1000) {
              cVar15 = cVar15 + -1;
              goto LAB_0014622a;
            }
            if (uVar11 < 10000) goto LAB_0014622a;
            bVar6 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar5 = cVar15 + '\x04';
          } while (bVar6);
          cVar15 = cVar15 + '\x01';
        }
LAB_0014622a:
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_170,cVar15);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_170._M_dataplus._M_p,(uint)local_170._M_string_length,uVar18);
        uVar18 = (args_01->elem_limits).max;
        if (9 < uVar18) {
          uVar11 = uVar18;
          cVar15 = '\x04';
          do {
            cVar16 = cVar15;
            if (uVar11 < 100) {
              cVar16 = cVar16 + -2;
              goto LAB_001462b2;
            }
            if (uVar11 < 1000) {
              cVar16 = cVar16 + -1;
              goto LAB_001462b2;
            }
            if (uVar11 < 10000) goto LAB_001462b2;
            bVar6 = 99999 < uVar11;
            uVar11 = uVar11 / 10000;
            cVar15 = cVar16 + '\x04';
          } while (bVar6);
          cVar16 = cVar16 + '\x01';
        }
LAB_001462b2:
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_148,cVar16);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_148._M_dataplus._M_p,(uint)local_148._M_string_length,uVar18);
        cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                  ((string *)&local_f8,(wabt *)"(min: ",(char (*) [7])&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                   (char (*) [8])&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a72df,
                   (char (*) [2])in_stack_fffffffffffffe78);
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
        if (local_f8.mc !=
            (ModuleContext *)
            ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
            8U)) {
          operator_delete(local_f8.mc);
        }
        ppFVar17 = local_150;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      IVar14 = IVar14 + 1;
      ppTVar23 = ppTVar23 + 1;
    } while ((pointer)ppTVar23 != ppFVar17);
    pMVar7 = (this->mc).module;
    if ((pMVar7->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar7->tables).super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar7 = (this->mc).module;
    }
  }
  ppDVar24 = (pMVar7->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_150 = (pointer)(pMVar7->data_segments).
                       super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)ppDVar24 != local_150) {
    do {
      pDVar3 = *ppDVar24;
      InitExp_abi_cxx11_(&local_170,this,&pDVar3->offset);
      cat<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[5]>
                ((string *)&local_f8,(wabt *)"data ",(char (*) [6])&pDVar3->name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(offset: ",
                 (char (*) [10])&local_170,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") = ",
                 in_stack_fffffffffffffe78);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      BinaryToString_abi_cxx11_((string *)&local_f8,this,&pDVar3->data);
      if ((Node *)(this->target_exp_width >> 1) <
          local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8.mc);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_f8.mc !=
          (ModuleContext *)
          ((long)&local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_> +
          8U)) {
        operator_delete(local_f8.mc);
      }
      ppDVar24 = ppDVar24 + 1;
    } while ((pointer)ppDVar24 != local_150);
    pMVar7 = (this->mc).module;
    if ((pMVar7->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pMVar7->data_segments).
        super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pMVar7 = (this->mc).module;
    }
  }
  local_150 = (pMVar7->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_100 = (pMVar7->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_150 != local_100) {
    local_108 = &this->cur_func;
    local_118 = &this->lst;
    local_110 = &(this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header;
    IVar14 = 0;
    local_128 = __return_storage_ptr__;
    do {
      f = *local_150;
      this->cur_func = f;
      args_2 = (char (*) [2])(f->name)._M_dataplus._M_p;
      name_02.data_ = (f->name)._M_dataplus._M_p;
      name_02.size_ = (f->name)._M_string_length;
      local_11c = IVar14;
      bVar6 = CheckImportExport(this,__return_storage_ptr__,First,IVar14,name_02);
      AST::AST(&local_f8,&this->mc,f);
      this->cur_ast = &local_f8;
      if (!bVar6) {
        AST::Construct(&local_f8,&f->exprs,
                       (Index)((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(f->decl).sig.result_types.
                                            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 2),true);
        this_00 = local_118;
        LoadStoreTracking::Track
                  (local_118,
                   local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                   _M_impl.super__Vector_impl_data._M_start);
        LoadStoreTracking::CheckLayouts(this_00);
      }
      cat<char[10],std::__cxx11::string,char[2]>
                (&local_170,(wabt *)"function ",(char (*) [10])f,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b2022,
                 args_2);
      __return_storage_ptr__ = local_128;
      std::__cxx11::string::_M_append((char *)local_128,(ulong)local_170._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      pTVar9 = (f->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (((long)(f->decl).sig.param_types.
                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar9 & 0x3fffffffcU) != 0) {
        uVar18 = 0;
        do {
          cVar15 = (char)&local_148;
          if (uVar18 == 0) {
            t.enum_ = pTVar9->enum_;
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            local_148._M_string_length = 0;
            local_148.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::push_back(cVar15);
          }
          else {
            std::__cxx11::string::append((char *)__return_storage_ptr__);
            t.enum_ = (f->decl).sig.param_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar18].enum_;
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            local_148._M_string_length = 0;
            local_148.field_2._M_local_buf[0] = '\0';
            uVar11 = uVar18 & 0xffffffff;
            do {
              uVar20 = (uint)uVar11;
              std::__cxx11::string::push_back(cVar15);
              uVar11 = (ulong)((int)(uVar11 / 0x1a) - 1);
            } while (0x19 < uVar20);
          }
          plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x1a0062);
          __return_storage_ptr__ = local_128;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          puVar1 = (ulong *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar1) {
            local_170.field_2._M_allocated_capacity = *puVar1;
            local_170.field_2._8_8_ = plVar8[3];
          }
          else {
            local_170.field_2._M_allocated_capacity = *puVar1;
            local_170._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_170._M_string_length = plVar8[1];
          *plVar8 = (long)puVar1;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          LocalDecl(&local_148,this,&local_170,t);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
          uVar18 = uVar18 + 1;
          pTVar9 = (f->decl).sig.param_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (uVar18 < ((ulong)((long)(f->decl).sig.param_types.
                                         super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9)
                           >> 2 & 0xffffffff));
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pTVar9 = (f->decl).sig.result_types.
               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = (int)((ulong)((long)(f->decl).sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar9) >> 2);
      if (iVar10 != 0) {
        if (iVar10 == 1) {
          EVar2 = pTVar9->enum_;
          ppcVar12 = (char **)(ulong)(uint)(EVar2 + ~(Func|I32U));
          if ((uint)(EVar2 + ~(Func|I32U)) < 0x20) {
            ppcVar13 = (char **)((long)&switchD_00146842::switchdataD_001a4c50 +
                                (long)(int)(&switchD_00146842::switchdataD_001a4c50)[(long)ppcVar12]
                                );
            local_148._M_dataplus._M_p = "byte";
            switch(ppcVar12) {
            case (char **)0x0:
              local_148._M_dataplus._M_p = "exnref";
              break;
            default:
switchD_00146842_caseD_ffffffe9:
              local_148._M_dataplus._M_p = "ILLEGAL";
              break;
            case (char **)0x6:
              local_148._M_dataplus._M_p = "nullref";
              break;
            case (char **)0x7:
              local_148._M_dataplus._M_p = "anyref";
              break;
            case (char **)0x8:
              local_148._M_dataplus._M_p = "funcref";
              break;
            case (char **)0x11:
              local_148._M_dataplus._M_p = "short";
              break;
            case (char **)0x12:
              break;
            case (char **)0x13:
              local_148._M_dataplus._M_p = "simd";
              break;
            case (char **)0x14:
              local_148._M_dataplus._M_p = "double";
              break;
            case (char **)0x15:
              local_148._M_dataplus._M_p = "float";
              break;
            case (char **)0x16:
              local_148._M_dataplus._M_p = "long";
              break;
            case (char **)0x17:
              local_148._M_dataplus._M_p = "int";
              break;
            case (char **)0x1c:
              local_148._M_dataplus._M_p = "ubyte";
              break;
            case (char **)0x1e:
              local_148._M_dataplus._M_p = "ushort";
              break;
            case (char **)0x1f:
              local_148._M_dataplus._M_p = "uint";
            }
          }
          else {
            ppcVar13 = ppcVar12;
            if (EVar2 == Void) {
              local_148._M_dataplus._M_p = "void";
            }
            else {
              if (EVar2 != Func) goto switchD_00146842_caseD_ffffffe9;
              local_148._M_dataplus._M_p = "func";
            }
          }
          cat<char[2],char_const*>(&local_170,(wabt *)":",(char (*) [2])&local_148,ppcVar13);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_170._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
        }
        else {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          pTVar9 = (f->decl).sig.result_types.
                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (((long)(f->decl).sig.result_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pTVar9 & 0x3fffffffcU) != 0) {
            lVar19 = 0;
            uVar18 = 0;
            do {
              if (uVar18 != 0) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                pTVar9 = (pointer)((long)&((f->decl).sig.result_types.
                                           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->enum_ +
                                  lVar19);
              }
              EVar2 = pTVar9->enum_;
              switch(EVar2) {
              case I8U:
                break;
              case I16U:
                break;
              case I32U:
                break;
              case Exnref:
                break;
              case 0xffffffe9:
              case Exnref|Hostref:
              case 0xffffffeb:
              case Exnref|I8U:
              case 0xffffffed:
              case 0xfffffff1:
              case Funcref|Hostref:
              case 0xfffffff3:
              case Funcref|I8U:
              case 0xfffffff5:
              case Funcref|I16U:
              case Funcref|I32U:
              case ~I32U:
              case Any:
              case ~I64:
              case Hostref:
              case ~F64:
              case ~I8:
switchD_001468c5_caseD_ffffffe9:
                break;
              case Nullref:
                break;
              case Anyref:
                break;
              case Funcref:
                break;
              case I16:
                break;
              case I8:
                break;
              case V128:
                break;
              case F64:
                break;
              case F32:
                break;
              case I64:
                break;
              case I32:
                break;
              default:
                if ((EVar2 != Void) && (EVar2 != Func)) goto switchD_001468c5_caseD_ffffffe9;
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              uVar18 = uVar18 + 1;
              pTVar9 = (f->decl).sig.result_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar19 = lVar19 + 4;
            } while (uVar18 < ((ulong)((long)(f->decl).sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pTVar9) >> 2 & 0xffffffff));
          }
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      if (bVar6) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        DecompileExpr((Value *)&local_170,this,
                      local_f8.exp_stack.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>
                      ._M_impl.super__Vector_impl_data._M_start,(Node *)0x0);
        IndentValue(this,(Value *)&local_170,this->indent_amount,(string_view)ZEXT816(0));
        sVar4 = local_170._M_string_length;
        for (_Var25._M_p = local_170._M_dataplus._M_p; _Var25._M_p != (pointer)sVar4;
            _Var25._M_p = _Var25._M_p + 0x20) {
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,*(ulong *)_Var25._M_p);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_170);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      ModuleContext::EndFunc(&this->mc);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
                  *)local_118,
                 (_Link_type)(this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                );
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_110;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_110;
      (this->lst).vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      IVar14 = local_11c + 1;
      *local_108 = (Func *)0x0;
      local_108[1] = (Func *)0x0;
      AST::~AST(&local_f8);
      local_150 = local_150 + 1;
    } while (local_150 != local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name, "(offset: ", InitExp(dat->offset), ") = ");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += ";";
      } else {
        s += " {\n";
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }